

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
write_bigint_value(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                   *this,string_view_type *sv)

{
  bignum_format_kind bVar1;
  bool bVar2;
  stream_sink<char> *psVar3;
  int signum;
  vector<unsigned_char,_std::allocator<unsigned_char>_> v;
  bigint n;
  basic_bigint<std::allocator<unsigned_char>_> local_68;
  basic_bigint<std::allocator<unsigned_char>_> local_40;
  
  bVar1 = (this->options_).bignum_format_;
  if (bVar1 == base64url) {
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&n,sv->_M_str,sv->_M_len);
    bVar2 = jsoncons::operator<(&n,0);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-(&local_68,&n);
      operator-((basic_bigint<std::allocator<unsigned_char>_> *)&v,&local_68,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                (&n,(basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy
                ((basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_68);
    }
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&n,&signum,&v);
    psVar3 = &this->sink_;
    stream_sink<char>::push_back(psVar3,'\"');
    if (bVar2) {
      stream_sink<char>::push_back(psVar3,'~');
    }
    encode_base64url<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,psVar3);
    stream_sink<char>::push_back(psVar3,'\"');
  }
  else {
    if (bVar1 != base64) {
      psVar3 = &this->sink_;
      if (bVar1 == number) {
        stream_sink<char>::append(psVar3,sv->_M_str,sv->_M_len);
        return;
      }
      stream_sink<char>::push_back(psVar3,'\"');
      stream_sink<char>::append(psVar3,sv->_M_str,sv->_M_len);
      stream_sink<char>::push_back(psVar3,'\"');
      return;
    }
    basic_bigint<std::allocator<unsigned_char>_>::from_string<char>(&n,sv->_M_str,sv->_M_len);
    bVar2 = jsoncons::operator<(&n,0);
    if (bVar2) {
      basic_bigint<std::allocator<unsigned_char>_>::operator-(&local_40,&n);
      operator-((basic_bigint<std::allocator<unsigned_char>_> *)&v,&local_40,1);
      basic_bigint<std::allocator<unsigned_char>_>::operator=
                (&n,(basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy
                ((basic_bigint<std::allocator<unsigned_char>_> *)&v);
      basic_bigint<std::allocator<unsigned_char>_>::destroy(&local_40);
    }
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    basic_bigint<std::allocator<unsigned_char>>::write_bytes_be<std::allocator<unsigned_char>>
              ((basic_bigint<std::allocator<unsigned_char>> *)&n,&signum,&v);
    psVar3 = &this->sink_;
    stream_sink<char>::push_back(psVar3,'\"');
    if (bVar2) {
      stream_sink<char>::push_back(psVar3,'~');
    }
    encode_base64<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::stream_sink<char>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,psVar3);
    stream_sink<char>::push_back(psVar3,'\"');
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  basic_bigint<std::allocator<unsigned_char>_>::destroy(&n);
  return;
}

Assistant:

void write_bigint_value(const string_view_type& sv)
        {
            switch (options_.bignum_format())
            {
                case bignum_format_kind::raw:
                {
                    sink_.append(sv.data(),sv.size());
                    break;
                }
                case bignum_format_kind::base64:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                case bignum_format_kind::base64url:
                {
                    bigint n = bigint::from_string(sv.data(), sv.length());
                    bool is_neg = n < 0;
                    if (is_neg)
                    {
                        n = - n -1;
                    }
                    int signum;
                    std::vector<uint8_t> v;
                    n.write_bytes_be(signum, v);

                    sink_.push_back('\"');
                    if (is_neg)
                    {
                        sink_.push_back('~');
                    }
                    encode_base64url(v.begin(), v.end(), sink_);
                    sink_.push_back('\"');
                    break;
                }
                default:
                {
                    sink_.push_back('\"');
                    sink_.append(sv.data(),sv.size());
                    sink_.push_back('\"');
                    break;
                }
            }
        }